

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O2

void pnga_matmul(char *transa,char *transb,void *alpha,void *beta,Integer g_a,Integer ailo,
                Integer aihi,Integer ajlo,Integer ajhi,Integer g_b,Integer bilo,Integer bihi,
                Integer bjlo,Integer bjhi,Integer g_c,Integer cilo,Integer cihi,Integer cjlo,
                Integer cjhi)

{
  long lVar1;
  undefined2 uVar2;
  DoubleComplex *pDVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Integer IVar9;
  Integer grp_id;
  Integer IVar10;
  Integer IVar11;
  logical lVar12;
  logical lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  uint *puVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  DoubleComplex *pDVar26;
  byte bVar27;
  uint uVar28;
  ulong uVar29;
  short sVar30;
  Integer IVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  undefined4 uVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  DoubleComplex *pDVar39;
  Integer *pIVar40;
  long lVar41;
  int iVar42;
  int iVar43;
  char *pcVar44;
  DoubleComplex *pDVar45;
  undefined2 uVar46;
  ulong uVar47;
  int iVar48;
  int iVar49;
  double dVar50;
  undefined4 uVar51;
  int iVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  long lVar56;
  int iVar57;
  long lVar58;
  long lVar59;
  ulong uVar60;
  long lVar61;
  int iVar62;
  ulong uVar63;
  double dVar64;
  bool bVar65;
  bool bVar66;
  bool bVar67;
  bool bVar68;
  double dVar69;
  ulong uStack_10650;
  ulong uStack_10648;
  Integer IStack_10640;
  DoubleComplex *pDStack_10638;
  SingleComplex SStack_10630;
  byte bStack_10628;
  DoubleComplex *pDStack_10620;
  ulong uStack_10618;
  ulong uStack_10610;
  double dStack_10608;
  Integer jdim_1;
  double dStack_105e0;
  undefined8 uStack_105d8;
  ulong uStack_105d0;
  Integer kdim_1;
  DoubleComplex *pDStack_105c0;
  double dStack_105b0;
  double dStack_105a8;
  Integer cdim;
  DoubleComplex *pDStack_10598;
  DoubleComplex *pDStack_10590;
  DoubleComplex *pDStack_10588;
  Integer IStack_10580;
  byte *pbStack_10578;
  byte *pbStack_10570;
  Integer cdim_prev;
  DoubleComplex *pDStack_10560;
  Integer atype;
  ulong uStack_10550;
  ulong uStack_10548;
  long lStack_10540;
  DoubleComplex ONE;
  Integer dims [2];
  SingleComplex ONE_CF;
  DoubleComplex *a_ar [2];
  DoubleComplex *c;
  DoubleComplex *b_ar [2];
  Integer idim;
  Integer rank;
  int iStack_1045c;
  Integer kdim;
  Integer *pIStack_10448;
  long lStack_10440;
  long lStack_10438;
  long lStack_10430;
  Integer ctype;
  Integer bdim_next;
  Integer jdim;
  undefined8 uStack_10410;
  Integer loB [2];
  Integer loA [2];
  Integer btype;
  Integer cndim;
  Integer IStack_103b0;
  Integer chi [2];
  Integer clo [2];
  Integer hiC [2];
  Integer loC [2];
  Integer hiB [2];
  Integer hiA [2];
  char *pcStack_10348;
  Integer ctype_1;
  Integer ld [2];
  Integer hiC_1 [2];
  int aiStack_10028 [8188];
  Integer irreg;
  int aiStack_8030 [5];
  uint local_801c [8187];
  
  IStack_10580 = ailo;
  pbStack_10578 = (byte *)transb;
  pbStack_10570 = (byte *)transa;
  IVar9 = pnga_nodeid();
  loA[0] = 0;
  loA[1] = 0;
  hiA[0] = 0;
  hiA[1] = 0;
  loB[0] = 0;
  loB[1] = 0;
  hiB[0] = 0;
  hiB[1] = 0;
  loC[0] = 0;
  loC[1] = 0;
  hiC[0] = 0;
  hiC[1] = 0;
  grp_id = pnga_get_pgroup(g_a);
  IVar10 = pnga_get_pgroup(g_b);
  IVar11 = pnga_get_pgroup(g_c);
  CYCLIC_DISTR_OPT_FLAG = '\x01';
  CONTIG_CHUNKS_OPT_FLAG = 0;
  DIRECT_ACCESS_OPT_FLAG = 0;
  bVar66 = _ga_sync_begin != 0;
  iStack_1045c = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar66) {
    pnga_pgroup_sync(grp_id);
  }
  if (IVar11 != grp_id || IVar10 != grp_id) {
    pnga_error("Arrays must be defined on same group",0);
  }
  lVar12 = pnga_is_mirrored(g_a);
  lVar13 = pnga_is_mirrored(g_b);
  if (lVar12 == lVar13) {
    lVar12 = pnga_is_mirrored(g_a);
    lVar13 = pnga_is_mirrored(g_c);
    if (lVar12 != lVar13) goto LAB_0012821b;
  }
  else {
LAB_0012821b:
    IVar10 = pnga_nnodes();
    pnga_error("Processors do not match for all arrays",IVar10);
  }
  pnga_inquire(g_a,&atype,&rank,dims);
  lVar23 = 1;
  if (rank < 3) {
    lVar59 = dims[0];
    if (rank == 1) {
      IVar10 = lVar23;
      if (aihi <= IStack_10580) {
        lVar59 = lVar23;
        IVar10 = dims[0];
      }
    }
    else {
      IVar10 = dims[1];
      if (rank != 2) {
        pcVar44 = "rank must be atleast 1";
        goto LAB_001282b6;
      }
    }
  }
  else {
    pcVar44 = "rank is greater than 2";
LAB_001282b6:
    pnga_error(pcVar44,rank);
    lVar59 = 0;
    IVar10 = 0;
  }
  pnga_inquire(g_b,&btype,&rank,dims);
  if (rank < 3) {
    lVar14 = dims[0];
    if (rank == 1) {
      IVar11 = lVar23;
      if (bihi <= bilo) {
        IVar11 = dims[0];
        lVar14 = lVar23;
      }
    }
    else {
      IVar11 = dims[1];
      if (rank != 2) {
        pcVar44 = "rank must be atleast 1";
        goto LAB_00128349;
      }
    }
  }
  else {
    pcVar44 = "rank is greater than 2";
LAB_00128349:
    pnga_error(pcVar44,rank);
    IVar11 = 0;
    lVar14 = 0;
  }
  pnga_inquire(g_c,&ctype,&rank,dims);
  if (rank < 3) {
    if (rank == 1) {
      IVar31 = dims[0];
      if (cilo < cihi) {
        IVar31 = lVar23;
        lVar23 = dims[0];
      }
    }
    else {
      IVar31 = dims[1];
      lVar23 = dims[0];
      if (rank != 2) {
        pcVar44 = "rank must be atleast 1";
        goto LAB_001283d8;
      }
    }
  }
  else {
    pcVar44 = "rank is greater than 2";
LAB_001283d8:
    pnga_error(pcVar44,rank);
    IVar31 = 0;
    lVar23 = 0;
  }
  lVar61 = CONCAT44(atype._4_4_,(int)atype);
  if ((lVar61 != btype) || (lVar61 != ctype)) {
    pnga_error(" types mismatch ",0);
    lVar61 = CONCAT44(atype._4_4_,(int)atype);
  }
  if ((4 < lVar61 - 0x3ebU) || (lVar61 - 0x3ebU == 2)) {
    pnga_error(" type error",lVar61);
  }
  if ((*pbStack_10570 | 0x20) == 0x6e) {
    if ((IStack_10580 < 1) || (IVar10 < ajhi || (ajlo < 1 || lVar59 < aihi))) {
LAB_001284ac:
      pnga_error("  g_a indices out of range ",g_a);
    }
  }
  else if ((IStack_10580 < 1) || (lVar59 < ajhi || (ajlo < 1 || IVar10 < aihi))) goto LAB_001284ac;
  if ((*pbStack_10578 | 0x20) == 0x6e) {
    if ((bilo < 1) || (IVar11 < bjhi || (bjlo < 1 || lVar14 < bihi))) {
LAB_00128538:
      pnga_error("  g_b indices out of range ",g_b);
    }
  }
  else if ((bilo < 1) || (lVar14 < bjhi || (bjlo < 1 || IVar11 < bihi))) goto LAB_00128538;
  if ((((cilo < 1) || (cjlo < 1)) || (lVar23 < cihi)) || (IVar31 < cjhi)) {
    pnga_error("  g_c indices out of range ",g_c);
  }
  lVar23 = aihi - IStack_10580;
  uVar17 = lVar23 + 1;
  lVar59 = bjhi - bjlo;
  if (cihi - cilo != lVar23) {
    pnga_error(" a & c dims error",uVar17);
  }
  lVar14 = ajhi - ajlo;
  uVar47 = lVar59 + 1;
  if (cjhi - cjlo != lVar59) {
    pnga_error(" b & c dims error",uVar47);
  }
  uVar18 = lVar14 + 1;
  if (bihi - bilo != lVar14) {
    pnga_error(" a & b dims error",uVar18);
  }
  if (((GA[g_c + 1000].irreg == 1) || (GA[g_b + 1000].irreg == 1)) ||
     ((GA[g_a + 1000].irreg == 1 || (_gai_matmul_patch_flag == 1)))) {
    bVar66 = true;
  }
  else {
    bVar66 = false;
  }
  pnga_inquire(g_c,&ctype,&rank,dims);
  if (dims[1] != uVar47 || dims[0] != uVar17) {
    bVar66 = true;
  }
  if ((bVar66) || (iVar4 = GA_Cluster_nnodes(), 1 < iVar4)) {
    sVar30 = 0;
  }
  else {
    sVar30 = 1;
    CONTIG_CHUNKS_OPT_FLAG = 1;
    DIRECT_ACCESS_OPT_FLAG = 1;
  }
  IVar10 = pnga_total_blocks(g_c);
  if (-1 < IVar10) {
    loA[0] = IStack_10580;
    loA[1] = ajlo;
    hiA[0] = aihi;
    hiA[1] = ajhi;
    loB[0] = bilo;
    loB[1] = bjlo;
    hiB[0] = bihi;
    hiB[1] = bjhi;
    loC[0] = cilo;
    loC[1] = cjlo;
    hiC[0] = cihi;
    hiC[1] = cjhi;
    pnga_matmul_basic((char *)pbStack_10570,(char *)pbStack_10578,alpha,beta,g_a,loA,hiA,g_b,loB,hiB
                      ,g_c,loC,hiC);
    return;
  }
  pnga_distribution(g_a,IVar9,loA,hiA);
  pnga_distribution(g_b,IVar9,loB,hiB);
  pnga_distribution(g_c,IVar9,loC,hiC);
  lVar41 = 0;
  uStack_105d0 = 0x10 / *(ulong *)(BYTE_ARRAY_001cd4a9 +
                                  CONCAT44(atype._4_4_,(int)atype) * 0x10 + 0xdf);
  lVar61 = hiA[0] - loA[0];
  if (hiC[0] - loC[0] < hiA[0] - loA[0]) {
    lVar61 = hiC[0] - loC[0];
  }
  lVar19 = hiB[1] - loB[1];
  if (hiC[1] - loC[1] < hiB[1] - loB[1]) {
    lVar19 = hiC[1] - loC[1];
  }
  lVar37 = hiB[0] - loB[0];
  if (hiA[1] - loA[1] < hiB[0] - loB[0]) {
    lVar37 = hiA[1] - loA[1];
  }
  if (lVar61 < 1) {
    lVar61 = lVar41;
  }
  uStack_10650 = lVar61 + 1;
  if (lVar19 < 1) {
    lVar19 = lVar41;
  }
  if (lVar37 < 1) {
    lVar37 = lVar41;
  }
  irreg = 0;
  uStack_10618 = lVar19 + 1;
  uVar60 = lVar37 + 1;
  if ((((3 < uStack_10650 / uVar60) || (3 < uVar60 / uStack_10650)) || (3 < uStack_10618 / uVar60))
     || (3 < uVar60 / uStack_10618)) {
    irreg = 1;
  }
  IVar9 = pnga_type_f2c(0x3f2);
  pnga_pgroup_gop(grp_id,IVar9,&irreg,1,"max");
  if (irreg == 1) {
    bVar66 = true;
  }
  bStack_10628 = (byte)sVar30;
  if (bVar66) {
    bVar67 = false;
    pDStack_10638 = (DoubleComplex *)0x0;
  }
  else {
    pDStack_10638 =
         gai_get_armci_memory
                   (uStack_10650,uStack_10618,uVar60,2 - sVar30,CONCAT44(atype._4_4_,(int)atype));
    bVar67 = pDStack_10638 != (DoubleComplex *)0x0;
    a_ar[0] = pDStack_10638;
  }
  IVar9 = CONCAT44(atype._4_4_,(int)atype);
  IVar10 = pnga_nnodes();
  irreg = pnga_memory_avail_type(IVar9);
  if (bVar66) {
    dVar69 = pow(((double)(long)uVar47 * (double)(long)uVar17 * (double)(long)uVar18) /
                 (double)(IVar10 * 10),0.3333333333333333);
    uVar24 = 0x100;
    if (0x100 < (long)dVar69) {
      uVar24 = (long)dVar69;
    }
  }
  else {
    iVar4 = (int)uStack_10618;
    if ((int)uStack_10618 < (int)uStack_10650) {
      iVar4 = (int)uStack_10650;
    }
    if (iVar4 <= (int)uVar60) {
      iVar4 = (int)uVar60;
    }
    uVar24 = (long)iVar4;
  }
  IVar10 = pnga_type_f2c(0x3f2);
  pnga_pgroup_gop(grp_id,IVar10,&irreg,1,"min");
  uVar53 = (ulong)bStack_10628 * 0x80 + 0x80;
  uVar16 = uVar53;
  uVar55 = uVar53;
  if ((long)uVar53 < (long)uVar24) {
    if ((irreg < 0x40) && (IVar10 = pnga_pgroup_nodeid(grp_id), IVar10 == 0)) {
      pnga_error("NotEnough memory",irreg);
    }
    uVar53 = (ulong)(uint)(3 << (bStack_10628 ^ 1));
    dVar69 = (double)((long)((long)((double)irreg * 0.9) - uVar53) / (long)uVar53);
    if (dVar69 < 0.0) {
      dStack_105a8 = dVar69;
      dVar50 = sqrt(dVar69);
      dVar69 = dStack_105a8;
    }
    else {
      dVar50 = SQRT(dVar69);
    }
    uVar63 = uVar24;
    if ((long)dVar50 < (long)uVar24) {
      if (dVar69 < 0.0) {
        dVar69 = sqrt(dVar69);
      }
      else {
        dVar69 = SQRT(dVar69);
      }
      uVar63 = (ulong)dVar69;
    }
    if (!bVar66) {
      uVar15 = 0x400;
      uVar24 = 0x400;
      uVar29 = 0x400;
      uVar54 = 0x400;
      if (!bVar67) goto LAB_00128c29;
LAB_00128c72:
      dVar69 = (double)(long)(uVar24 * uVar24);
      uVar55 = uVar54;
      if (((long)uVar54 < (long)uVar24) && ((long)uVar24 < (long)uVar15)) {
        if ((long)(dVar69 / (double)(long)uVar54) <= (long)uVar15) {
          uVar15 = (long)(dVar69 / (double)(long)uVar54);
        }
        uVar53 = uVar15;
        uVar16 = (long)(dVar69 / (double)(long)uVar15);
        if ((long)uVar29 < (long)(dVar69 / (double)(long)uVar15)) {
          uVar16 = uVar29;
        }
      }
      else {
        uVar53 = uVar24;
        uVar16 = uVar24;
        uVar55 = uVar24;
        if (((long)uVar24 < (long)uVar54) && ((long)uVar15 < (long)uVar24)) {
          uVar16 = (ulong)((1.0 / (double)(long)uVar15) * dVar69);
          uVar55 = uVar54;
          if ((long)uVar16 <= (long)uVar54) {
            uVar55 = uVar16;
          }
          uVar53 = uVar15;
          if ((long)uVar29 < (long)uVar16) {
            uVar16 = uVar29;
          }
        }
      }
      goto LAB_00128cce;
    }
LAB_00128c29:
    uVar15 = uVar60;
    uVar24 = uVar63;
    uVar29 = uStack_10618;
    uVar54 = uStack_10650;
    if (!bVar66) goto LAB_00128c72;
    uVar55 = uVar17;
    if ((long)uVar63 < (long)uVar17) {
      uVar55 = uVar63;
    }
    uVar16 = uVar47;
    if ((long)uVar63 < (long)uVar47) {
      uVar16 = uVar63;
    }
    uVar53 = uVar18;
    if ((long)uVar63 < (long)uVar18) {
      uVar53 = uVar63;
    }
LAB_00128d44:
    uStack_10550 = 1;
    uStack_10650 = uVar55;
    if ((long)uVar55 < 2) {
      uStack_10650 = uStack_10550;
    }
    uStack_10618 = uVar16;
    if ((long)uVar16 < 2) {
      uStack_10618 = uStack_10550;
    }
    if (1 < (long)uVar53) {
      uStack_10550 = uVar53;
    }
  }
  else {
LAB_00128cce:
    if ((bVar66) || ((CONTIG_CHUNKS_OPT_FLAG & 1) != 0)) goto LAB_00128d44;
    if (((long)uVar55 <= (long)uStack_10650) || ((long)uVar16 <= (long)uStack_10618)) {
      if ((double)(long)uStack_10650 < (double)(long)(uVar24 * uVar24)) {
        lVar61 = (long)((double)(long)(uVar24 * uVar24) / (double)(long)uStack_10650);
        uVar16 = uStack_10618;
        if (lVar61 <= lVar19) {
          uVar17 = 1;
          do {
            uVar16 = uStack_10618 / uVar17;
            uVar17 = uVar17 + 1;
          } while (lVar61 < (long)uVar16);
        }
        uVar53 = uVar16;
        uVar55 = uStack_10650;
        if ((long)uStack_10650 < (long)uVar16) {
          uVar53 = uStack_10650;
        }
      }
      goto LAB_00128d44;
    }
    uStack_10550 = uStack_10618;
    if (uStack_10650 < uStack_10618) {
      uStack_10550 = uStack_10650;
    }
  }
  lVar61 = uStack_10550 << (bStack_10628 ^ 1);
  uVar17 = *(ulong *)(BYTE_ARRAY_001cd4a9 + IVar9 * 0x10 + 0xdf);
  if (pDStack_10638 == (DoubleComplex *)0x0) {
    pDStack_10638 =
         gai_get_armci_memory
                   (uStack_10650,uStack_10618,uStack_10550,2 - sVar30,
                    CONCAT44(atype._4_4_,(int)atype));
    a_ar[0] = pDStack_10638;
    if (pDStack_10638 == (DoubleComplex *)0x0) {
      pDStack_10638 =
           (DoubleComplex *)
           pnga_malloc((uint)(0x30 << (bStack_10628 ^ 1)) / uVar17 + lVar61 * uStack_10650 +
                       (lVar61 + uStack_10650) * uStack_10618,(int)atype,"GA mulmat bufs");
      a_ar[0] = pDStack_10638;
    }
    else {
      bVar67 = true;
    }
  }
  uVar17 = (uStack_10550 * uStack_10650) / uStack_105d0;
  if (bStack_10628 == 0) {
    a_ar[1] = pDStack_10638 + uVar17 + 1;
    lVar61 = uVar17 * 2 + 2;
    uVar18 = (uStack_10550 * uStack_10618) / uStack_105d0;
    uVar47 = uVar17 * 2 + uVar18 + 2;
    b_ar[1] = pDStack_10638 + uVar17 * 2 + uVar18 + 3;
  }
  else {
    lVar61 = uVar17 + 1;
    uVar18 = (uStack_10550 * uStack_10618) / uStack_105d0;
    uVar47 = uVar17;
  }
  b_ar[0] = pDStack_10638 + lVar61;
  pDStack_10620 = b_ar[0];
  lVar61 = CONCAT44(atype._4_4_,(int)atype);
  if (lVar61 == 0x3ec) {
    bVar65 = NAN(*beta);
    bVar68 = *beta == 0.0;
LAB_00128fb5:
    if ((bVar68) && (!bVar65)) {
      bVar65 = true;
      goto LAB_00128fbf;
    }
  }
  else {
    if (lVar61 != 0x3ee) {
      if (lVar61 == 0x3ef) {
        if ((*beta != 0.0) || (NAN(*beta))) goto LAB_00128fbd;
        bVar65 = NAN(*(double *)((long)beta + 8));
        bVar68 = *(double *)((long)beta + 8) == 0.0;
      }
      else {
        bVar65 = NAN(*beta);
        bVar68 = *beta == 0.0;
      }
      goto LAB_00128fb5;
    }
    if ((*beta == 0.0) && (!NAN(*beta))) {
      bVar65 = NAN(*(float *)((long)beta + 4));
      bVar68 = *(float *)((long)beta + 4) == 0.0;
      goto LAB_00128fb5;
    }
  }
LAB_00128fbd:
  bVar65 = false;
LAB_00128fbf:
  clo[0] = cilo;
  clo[1] = cjlo;
  chi[0] = cihi;
  chi[1] = cjhi;
  if (!bVar65) {
    pnga_scale_patch(g_c,clo,chi,beta);
  }
  pDVar45 = pDStack_10638 + uVar47 + uVar18 + 2;
  lVar61 = CONCAT44(atype._4_4_,(int)atype);
  if (bStack_10628 == 0) {
    if (!bVar66) {
      uStack_10548 = 0;
      pnga_nodeid();
      kdim_1 = 1;
      pDStack_105c0 = (DoubleComplex *)0x1;
      cdim_prev = 1;
      pDStack_10560 = (DoubleComplex *)0x1;
      jdim = 0x3ff0000000000000;
      uStack_10410 = 0;
      IStack_103b0 = 0x3f800000;
      ONE.real = (double)cilo;
      jdim_1 = cihi;
      ONE.imag = (double)cjlo;
      dStack_105e0 = (double)cjhi;
      pnga_local_iterator_init(g_c,(_iterator_hdl *)ld);
      uVar2 = 0;
      uStack_105d8 = 0;
      SStack_10630.real = 0.0;
      SStack_10630.imag = 0.0;
      bVar66 = true;
      do {
        do {
          iVar4 = pnga_local_iterator_next
                            ((_iterator_hdl *)ld,&kdim_1,&cdim_prev,&pcStack_10348,&idim);
          if (iVar4 == 0) goto LAB_0012aa3a;
          pnga_inquire(g_c,&ctype_1,&cndim,&kdim);
          lVar12 = pnga_patch_intersect((Integer *)&ONE,&jdim_1,&kdim_1,&cdim_prev,cndim);
        } while (lVar12 == 0);
        lStack_10540 = CONCAT44(lStack_10540._4_4_,0xffffffff);
        do {
          pDVar3 = pDStack_10560;
          IVar10 = cdim_prev;
          pDVar26 = pDStack_105c0;
          IVar9 = kdim_1;
          pDStack_10588 = b_ar[0];
          c = pDVar45;
          bVar68 = (int)lStack_10540 != -1;
          lVar23 = (cdim_prev - kdim_1) + 1;
          uVar5 = ((int)(lVar23 / (long)uStack_10650) + 1) -
                  (uint)(lVar23 % (long)uStack_10650 == 0);
          uStack_105d0 = (ulong)uVar5;
          if (0x400 < (int)uVar5) {
            pnga_error("Increase MAX_CHUNKS value in matmul.h",0);
          }
          uVar17 = uStack_10550;
          lVar23 = IVar9 + -1;
          pDVar39 = (DoubleComplex *)(long)(int)lStack_10540;
          if ((int)lStack_10540 == -1) {
            pDVar39 = (DoubleComplex *)((long)&pDVar26[-1].imag + 7);
          }
          pDStack_10598 = (DoubleComplex *)(long)(int)uStack_10548;
          iVar6 = 1 - (int)IVar9;
          dStack_105a8 = (double)CONCAT44(dStack_105a8._4_4_,iVar6);
          iVar7 = (int)IVar9 + -1;
          dStack_105b0 = (double)CONCAT44(dStack_105b0._4_4_,iVar7);
          uVar47 = 0;
          iVar4 = 0;
          iVar48 = 0;
          while (pDVar26 = pDVar39, (long)pDVar26 < (long)pDVar3) {
            pDStack_10590 = (DoubleComplex *)((long)&pDVar26->real + uStack_10618);
            pDVar39 = pDVar3;
            if ((long)pDStack_10590 < (long)pDVar3) {
              pDVar39 = pDStack_10590;
            }
            iVar42 = (int)pDVar39 + -1;
            uVar46 = uVar2;
            uVar18 = (ulong)pDStack_10598;
            if (!bVar68) {
              uVar46 = 1;
              uVar18 = uVar47;
            }
            uVar47 = uVar18;
            iVar36 = (int)pDVar26;
            uVar18 = uVar47;
            while (pDVar39 = pDStack_10590, (long)uVar18 <= lVar14) {
              if (0x3ff < (int)uStack_105d0 + iVar48) {
                CYCLIC_DISTR_OPT_FLAG = '\x01';
                lStack_10540 = CONCAT44(lStack_10540._4_4_,iVar36);
                uStack_10548 = uVar18;
                uVar2 = uVar46;
                goto LAB_0012a21b;
              }
              uVar60 = uVar18 + uStack_10550;
              iVar43 = (int)lVar14;
              if ((long)uVar60 <= lVar14) {
                iVar43 = (int)uVar60 + -1;
              }
              iVar49 = (int)uVar18;
              iVar57 = (iVar43 - iVar49) + 1;
              pIVar40 = &irreg + (long)iVar48 * 4;
              bVar68 = false;
              lVar59 = lVar23;
              lVar41 = IVar9 + (uStack_10650 - 1);
              iVar21 = iVar6;
              iVar52 = iVar7;
              while( true ) {
                lVar19 = lVar41;
                if (IVar10 < lVar41) {
                  lVar19 = IVar10;
                }
                if (IVar10 <= lVar59) break;
                lVar59 = lVar59 + uStack_10650;
                iVar62 = (int)IVar10;
                if (lVar59 < IVar10) {
                  iVar62 = (int)lVar59;
                }
                *(int *)(pIVar40 + 2) = (int)lVar19 + iVar21;
                *(int *)((long)pIVar40 + 0x14) = iVar57;
                *(int *)pIVar40 = iVar52;
                *(int *)(pIVar40 + 1) = iVar62 + -1;
                *(int *)((long)pIVar40 + 4) = iVar49;
                *(int *)((long)pIVar40 + 0xc) = iVar43;
                *(undefined2 *)((long)pIVar40 + 0x1c) = uVar46;
                if (bVar68) {
                  iVar62 = (int)pIVar40[-1];
                }
                else {
                  lVar19 = (long)iVar4;
                  aiStack_10028[lVar19 * 8] = iVar57;
                  aiStack_10028[lVar19 * 8 + 1] = (iVar42 - iVar36) + 1;
                  *(int *)(hiC_1 + lVar19 * 4) = iVar49;
                  *(int *)(hiC_1 + lVar19 * 4 + 1) = iVar43;
                  *(int *)((long)hiC_1 + lVar19 * 0x20 + 4) = iVar36;
                  *(int *)((long)hiC_1 + lVar19 * 0x20 + 0xc) = iVar42;
                  iVar62 = iVar4;
                  iVar4 = iVar4 + 1;
                }
                *(int *)(pIVar40 + 3) = iVar62;
                iVar48 = iVar48 + 1;
                pIVar40 = pIVar40 + 4;
                iVar52 = iVar52 + (int)uStack_10650;
                iVar21 = iVar21 - (int)uStack_10650;
                lVar41 = lVar41 + uStack_10650;
                bVar68 = true;
              }
              bVar68 = false;
              uVar47 = 0;
              uVar46 = 0;
              uVar18 = uVar60;
            }
          }
          if (CYCLIC_DISTR_OPT_FLAG == '\0') {
            IVar9 = pnga_get_pgroup(g_a);
            uVar47 = pnga_pgroup_nodeid(IVar9);
            iVar4 = GA[g_a + 1000].nblock[0];
            iVar6 = GA[g_a + 1000].nblock[1];
            puVar20 = local_801c;
            for (lVar59 = lVar23; lVar59 < IVar10; lVar59 = lVar59 + uStack_10650) {
              *(undefined2 *)puVar20 = 0;
              puVar20 = puVar20 + 8;
            }
            uVar47 = (ulong)(uint)((int)uVar47 >> 0x1f) << 0x20 | uVar47 & 0xffffffff;
            puVar20 = local_801c +
                      (long)(((int)((long)uVar47 / (long)iVar4) + (int)((long)uVar47 % (long)iVar4))
                            % iVar6) * 8;
            for (; lVar23 < IVar10; lVar23 = lVar23 + uStack_10650) {
              *(undefined2 *)puVar20 = 1;
              puVar20 = puVar20 + 8;
            }
          }
LAB_0012a21b:
          bVar27 = (iVar48 == 1 && (long)pDVar26 < (long)pDVar3) & ~DIRECT_ACCESS_OPT_FLAG;
          pDStack_10590 = (DoubleComplex *)CONCAT71(pDStack_10590._1_7_,bVar27);
          if (bVar27 == 1) {
            if ((((long)uStack_10650 <= cdim_prev - kdim_1) ||
                ((long)uStack_10618 <= (long)pDStack_10560 - (long)pDStack_105c0)) ||
               ((long)uVar17 <= lVar14)) {
              pnga_error("Invalid task list",0);
            }
            pnga_access_ptr(g_c,&kdim_1,&cdim_prev,&c,&idim);
          }
          uVar17 = 0;
          if (CYCLIC_DISTR_OPT_FLAG == '\0') {
            IVar9 = pnga_get_pgroup(g_a);
            uVar17 = pnga_pgroup_nodeid(IVar9);
            uVar17 = (ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff;
            uVar17 = (long)((int)((long)uVar17 / (long)GA[g_a + 1000].nblock[0]) +
                           (int)((long)uVar17 % (long)GA[g_a + 1000].nblock[0])) %
                     (long)GA[g_a + 1000].nblock[1] & 0xffffffff;
          }
          iVar4 = (int)uVar17;
          if (iVar4 < iVar48) {
            uVar5 = local_801c[(long)iVar4 * 8 + -1];
            GET_BLOCK(g_a,(task_list_t *)(&irreg + (long)iVar4 * 4),a_ar[0],(char *)pbStack_10570,
                      IStack_10580,ajlo,(Integer *)&ONE_CF,gNbhdlA);
            uStack_105d8 = (long)(int)uVar5;
            GET_BLOCK(g_b,(task_list_t *)(hiC_1 + (long)(int)uVar5 * 4),pDStack_10588,
                      (char *)pbStack_10578,bilo,bjlo,&bdim_next,gNbhdlB);
            SStack_10630 = ONE_CF;
            bVar66 = true;
          }
          pDStack_10598 = (DoubleComplex *)((ulong)pDStack_10598 & 0xffffffff00000000);
          uVar18 = 1;
          dStack_105b0 = 0.0;
          uVar47 = 0;
          while (IVar9 = bdim_next, (int)uVar17 < iVar48) {
            lVar23 = (long)(int)uVar17;
            uVar5 = local_801c[lVar23 * 8 + -1];
            iVar6 = aiStack_8030[lVar23 * 8 + 2];
            if (bVar65) {
              pDStack_10598 =
                   (DoubleComplex *)
                   CONCAT44(pDStack_10598._4_4_,(uint)(ushort)local_801c[lVar23 * 8]);
            }
            lVar59 = (long)(int)uVar5 * 0x20;
            iVar7 = aiStack_10028[(long)(int)uVar5 * 8 + 1];
            dStack_105a8 = (double)(long)(int)local_801c[lVar23 * 8 + -2];
            uVar28 = (uint)uVar18;
            if ((CYCLIC_DISTR_OPT_FLAG == '\0') && ((int)uVar28 < iVar48)) {
              uVar28 = (int)(iVar4 + uVar28) % iVar48;
            }
            uStack_105d0 = uVar18;
            pDVar39 = a_ar[uVar47];
            cdim = (long)iVar6;
            pnga_nbwait(gNbhdlA + uVar47);
            if (bVar66) {
              pDStack_10588 = b_ar[(ulong)dStack_105b0 & 0xffffffff];
              pnga_nbwait(gNbhdlB + ((ulong)dStack_105b0 & 0xffffffff));
            }
            if ((int)uVar28 < iVar48) {
              uVar8 = (uint)uVar47 ^ 1;
              GET_BLOCK(g_a,(task_list_t *)(&irreg + (long)(int)uVar28 * 4),a_ar[uVar8],
                        (char *)pbStack_10570,IStack_10580,ajlo,(Integer *)&ONE_CF,gNbhdlA + uVar8);
              uVar8 = local_801c[(long)(int)uVar28 * 8 + -1];
              uVar22 = uVar5;
              if (uVar5 != uVar8) {
                uVar22 = ~SUB84(dStack_105b0,0) & 1;
                dStack_105b0 = (double)(ulong)uVar22;
                uVar17 = (ulong)(uVar22 * 8);
                GET_BLOCK(g_b,(task_list_t *)(hiC_1 + (long)(int)uVar8 * 4),
                          *(void **)((long)b_ar + uVar17),(char *)pbStack_10578,bilo,bjlo,&bdim_next
                          ,(Integer *)((long)gNbhdlB + uVar17));
                uVar22 = uVar8;
              }
              uStack_105d8 = (ulong)uVar22;
            }
            bVar66 = uVar5 != (uint)uStack_105d8;
            GAI_DGEMM(lVar61,(char *)pbStack_10570,(char *)pbStack_10578,(long)iVar6,(long)iVar7,
                      (Integer)dStack_105a8,alpha,pDVar39,(Integer)SStack_10630,pDStack_10588,IVar9,
                      c,cdim);
            if ((char)pDStack_10590 == '\0') {
              ONE.real = (double)((int)(&irreg)[lVar23 * 4] + cilo);
              jdim_1 = aiStack_8030[lVar23 * 8] + cilo;
              ONE.imag = (double)(*(int *)((long)hiC_1 + lVar59 + 4) + cjlo);
              dStack_105e0 = (double)(*(int *)((long)hiC_1 + lVar59 + 0xc) + cjlo);
              if ((lVar61 == 0x3ee) || (lVar61 == 0x3eb)) {
                if ((short)pDStack_10598 == 1) goto LAB_0012a73e;
                pIVar40 = &IStack_103b0;
              }
              else {
                if ((short)pDStack_10598 == 1) {
LAB_0012a73e:
                  pnga_put(g_c,(Integer *)&ONE,&jdim_1,c,&cdim);
                  goto LAB_0012a77c;
                }
                pIVar40 = &jdim;
              }
              pnga_acc(g_c,(Integer *)&ONE,&jdim_1,c,&cdim,pIVar40);
            }
LAB_0012a77c:
            uVar47 = (ulong)(~(uint)uVar47 & 1);
            SStack_10630 = ONE_CF;
            uVar18 = (ulong)((int)uStack_105d0 + 1);
            uVar17 = (ulong)uVar28;
          }
        } while ((long)pDVar26 < (long)pDVar3);
      } while( true );
    }
    dStack_105a8 = (double)pnga_nnodes();
    cdim_prev = 0;
    IVar9 = pnga_get_pgroup(g_a);
    irreg = 0x3ff0000000000000;
    aiStack_8030[0] = 0;
    aiStack_8030[1] = 0;
    idim = 0x3f800000;
    IVar9 = pnga_pgroup_nodeid(IVar9);
    hiC_1[0] = cilo;
    hiC_1[1] = cjlo;
    ld[0] = cihi;
    ld[1] = cjhi;
    if (bVar65) {
      pnga_fill_patch(g_c,hiC_1,ld,beta);
    }
    pIStack_10448 = &idim;
    lVar41 = 0;
    uVar51 = 0;
    iVar4 = 0;
    uVar35 = 0;
    uStack_105d8 = (ulong)uStack_105d8._4_4_ << 0x20;
    pDStack_10638 = (DoubleComplex *)0x0;
    pDStack_10598 = (DoubleComplex *)0x0;
    SStack_10630 = (SingleComplex)0x0;
    uStack_105d0 = 0;
    lVar19 = 0;
    dVar69 = 0.0;
    pDStack_10588 = (DoubleComplex *)0x0;
    bVar66 = false;
    uStack_10648 = 0;
    uStack_10610 = 0;
    lVar37 = 0;
    while (lVar58 = lVar37, lVar58 <= lVar59) {
      lVar32 = lVar58 + -1 + uStack_10618;
      if (lVar59 < (long)(lVar58 + uStack_10618)) {
        lVar32 = lVar59;
      }
      jdim_1 = (lVar32 - lVar58) + 1;
      lStack_10438 = lVar58 + bjlo;
      lStack_10440 = bjlo + lVar32;
      lVar33 = 0;
      while (lVar37 = lVar58 + uStack_10618, lVar33 <= lVar14) {
        lVar37 = lVar33 + uStack_10550;
        lVar38 = lVar33 + -1 + uStack_10550;
        if (lVar14 < lVar37) {
          lVar38 = lVar14;
        }
        dStack_10608 = (double)((lVar38 - lVar33) + 1);
        kdim_1 = (Integer)dStack_10608;
        lVar1 = lVar33 + ajlo;
        uStack_10548 = ajlo + lVar38;
        lVar34 = lVar33 + bilo;
        lStack_10430 = lVar38 + bilo;
        iVar6 = 1;
        lVar38 = 0;
        while (lVar33 = lVar37, lVar38 <= lVar23) {
          lVar33 = uStack_10650 + lVar38;
          dVar50 = dVar69;
          if ((long)pDStack_10638 % (long)dStack_105a8 == IVar9) {
            lVar56 = lVar33 + -1;
            if (lVar23 < lVar33) {
              lVar56 = lVar23;
            }
            dVar64 = (double)((lVar56 - lVar38) + 1);
            dStack_105b0 = (double)CONCAT44(dStack_105b0._4_4_,uVar51);
            pDStack_10590 = (DoubleComplex *)CONCAT44(pDStack_10590._4_4_,uVar35);
            if ((*pbStack_10570 | 0x20) == 0x6e) {
              pDVar26 = &ONE;
              hiC_1[0] = IStack_10580 + lVar38;
              hiC_1[1] = lVar1;
              ld[0] = lVar56 + IStack_10580;
              ld[1] = uStack_10548;
              dStack_10608 = dVar64;
            }
            else {
              hiC_1[1] = IStack_10580 + lVar38;
              ld[1] = lVar56 + IStack_10580;
              pDVar26 = (DoubleComplex *)&kdim_1;
              hiC_1[0] = lVar1;
              ld[0] = uStack_10548;
            }
            dVar50 = dStack_10608;
            lStack_10540 = lVar19;
            ONE.real = dVar64;
            pnga_nbget(g_a,hiC_1,ld,a_ar[uStack_10648],(Integer *)pDVar26,gNbhdlA + uStack_10648);
            if (iVar6 != 0) {
              pIVar40 = &kdim_1;
              hiC_1[0] = lVar34;
              hiC_1[1] = lStack_10438;
              ld[0] = lStack_10430;
              ld[1] = lStack_10440;
              if ((*pbStack_10578 | 0x20) != 0x6e) {
                pIVar40 = &jdim_1;
                hiC_1[0] = lStack_10438;
                hiC_1[1] = lVar34;
                ld[0] = lStack_10440;
                ld[1] = lStack_10430;
              }
              pDStack_10598 = (DoubleComplex *)*pIVar40;
              pnga_nbget(g_b,hiC_1,ld,b_ar[uStack_10610],pIVar40,gNbhdlB + uStack_10610);
            }
            if (bVar66) {
              lVar19 = uStack_105d0 * (long)SStack_10630;
              if (lVar19 < 1) {
                lVar19 = 0;
              }
              if (lVar61 == 0x3eb) {
                for (lVar25 = 0; lVar19 != lVar25; lVar25 = lVar25 + 1) {
                  *(undefined4 *)((long)&pDVar45->real + lVar25 * 4) = 0;
                }
              }
              else if (lVar61 == 0x3ec) {
                for (lVar25 = 0; lVar19 != lVar25; lVar25 = lVar25 + 1) {
                  (&pDVar45->real)[lVar25] = 0.0;
                }
              }
              else {
                pDVar26 = pDVar45;
                if (lVar61 == 0x3ee) {
                  for (lVar25 = 0; lVar19 != lVar25; lVar25 = lVar25 + 1) {
                    (&pDVar45->real)[lVar25] = 0.0;
                  }
                }
                else {
                  while (bVar66 = lVar19 != 0, lVar19 = lVar19 + -1, bVar66) {
                    pDVar26->real = 0.0;
                    pDVar26->imag = 0.0;
                    pDVar26 = pDVar26 + 1;
                  }
                }
              }
              uVar17 = (ulong)(((uint)uStack_10648 ^ 1) << 3);
              pDVar26 = *(DoubleComplex **)((long)a_ar + uVar17);
              pnga_nbwait((Integer *)((long)gNbhdlA + uVar17));
              if ((int)uStack_105d8 != 0) {
                uVar17 = (ulong)(((uint)uStack_10610 ^ 1) << 3);
                pDStack_10620 = *(DoubleComplex **)((long)b_ar + uVar17);
                pnga_nbwait((Integer *)((long)gNbhdlB + uVar17));
              }
              GAI_DGEMM(lVar61,(char *)pbStack_10570,(char *)pbStack_10578,(Integer)SStack_10630,
                        uStack_105d0,lStack_10540,alpha,pDVar26,(Integer)dVar69,pDStack_10620,
                        (Integer)pDStack_10588,pDVar45,cdim_prev);
              hiC_1[0] = (int)pDStack_10590 + cilo;
              ld[0] = dStack_105b0._0_4_ + cilo;
              hiC_1[1] = (int)lVar41 + cjlo;
              ld[1] = iVar4 + cjlo;
              if ((lVar61 == 0x3ee) || (lVar61 == 0x3eb)) {
                pIVar40 = &idim;
              }
              else {
                pIVar40 = &irreg;
              }
              pnga_acc(g_c,hiC_1,ld,pDVar45,&cdim_prev,pIVar40);
            }
            uStack_10648 = uStack_10648 ^ 1;
            SStack_10630 = (SingleComplex)ONE.real;
            uStack_105d0 = jdim_1;
            uStack_10610 = (ulong)((uint)uStack_10610 ^ iVar6 != 0);
            bVar66 = true;
            uVar51 = (undefined4)lVar56;
            iVar4 = (int)lVar32;
            uVar35 = (undefined4)lVar38;
            uStack_105d8 = CONCAT44(uStack_105d8._4_4_,iVar6);
            pDStack_10588 = pDStack_10598;
            iVar6 = 0;
            dStack_10608 = (double)kdim_1;
            lVar41 = lVar58;
            lVar19 = kdim_1;
            cdim_prev = (Integer)dVar64;
          }
          pDStack_10638 = (DoubleComplex *)((long)pDStack_10638 + 1);
          lVar38 = lVar33;
          dVar69 = dVar50;
        }
      }
    }
    if (bVar66) {
      lVar23 = 0;
      if (0 < (long)(uStack_105d0 * (long)SStack_10630)) {
        lVar23 = uStack_105d0 * (long)SStack_10630;
      }
      if (lVar61 == 0x3eb) {
        for (lVar59 = 0; lVar23 != lVar59; lVar59 = lVar59 + 1) {
          *(undefined4 *)((long)&pDVar45->real + lVar59 * 4) = 0;
        }
      }
      else if (lVar61 == 0x3ec) {
        for (lVar59 = 0; lVar23 != lVar59; lVar59 = lVar59 + 1) {
          (&pDVar45->real)[lVar59] = 0.0;
        }
      }
      else {
        pDVar26 = pDVar45;
        if (lVar61 == 0x3ee) {
          for (lVar59 = 0; lVar23 != lVar59; lVar59 = lVar59 + 1) {
            (&pDVar45->real)[lVar59] = 0.0;
          }
        }
        else {
          while (bVar66 = lVar23 != 0, lVar23 = lVar23 + -1, bVar66) {
            pDVar26->real = 0.0;
            pDVar26->imag = 0.0;
            pDVar26 = pDVar26 + 1;
          }
        }
      }
      pDStack_10590 = (DoubleComplex *)CONCAT44(pDStack_10590._4_4_,uVar35);
      dStack_105b0 = (double)CONCAT44(dStack_105b0._4_4_,uVar51);
      uVar17 = (ulong)(((uint)uStack_10648 ^ 1) << 3);
      pDVar26 = *(DoubleComplex **)((long)a_ar + uVar17);
      pnga_nbwait((Integer *)((long)gNbhdlA + uVar17));
      if ((int)uStack_105d8 != 0) {
        uVar17 = (ulong)(((uint)uStack_10610 ^ 1) << 3);
        pDStack_10620 = *(DoubleComplex **)((long)b_ar + uVar17);
        pnga_nbwait((Integer *)((long)gNbhdlB + uVar17));
      }
      GAI_DGEMM(lVar61,(char *)pbStack_10570,(char *)pbStack_10578,(Integer)SStack_10630,
                uStack_105d0,lVar19,alpha,pDVar26,(Integer)dVar69,pDStack_10620,
                (Integer)pDStack_10588,pDVar45,cdim_prev);
      hiC_1[0] = (int)pDStack_10590 + cilo;
      ld[0] = dStack_105b0._0_4_ + cilo;
      hiC_1[1] = (int)lVar41 + cjlo;
      ld[1] = iVar4 + cjlo;
      if ((lVar61 != 0x3eb) && (lVar61 != 0x3ee)) {
        pIStack_10448 = &irreg;
      }
      pnga_acc(g_c,hiC_1,ld,pDVar45,&cdim_prev,pIStack_10448);
    }
  }
  else {
    bVar66 = false;
    cdim_prev = (Integer)pDVar45;
    IVar9 = pnga_nodeid();
    irreg = 0;
    aiStack_8030[0] = 0;
    aiStack_8030[1] = 0;
    hiC_1[0] = 0;
    hiC_1[1] = 0;
    ONE.real = 1.0;
    ONE.imag = 0.0;
    ONE_CF.real = 1.0;
    ONE_CF.imag = 0.0;
    pnga_distribution(g_c,IVar9,&irreg,hiC_1);
    iVar4 = (int)hiC_1[0];
    iVar48 = (int)irreg;
    iVar7 = (int)hiC_1[1];
    iVar6 = (int)aiStack_8030._0_8_;
    if (DIRECT_ACCESS_OPT_FLAG == 0) {
      if ((((long)uStack_10650 < (long)((iVar4 - iVar48) + 1)) ||
          ((long)uStack_10618 < (long)(((ulong)(uint)(iVar7 - iVar6) << 0x20) + 0x100000000) >> 0x20
          )) || ((long)uStack_10550 < (lVar14 << 0x20) + 0x100000000 >> 0x20)) {
        bVar66 = false;
      }
      else {
        pnga_access_ptr(g_c,&irreg,hiC_1,&cdim_prev,ld);
        bVar66 = true;
      }
    }
    uStack_10548 = (ulong)(iVar7 + -1);
    lVar14 = (long)(int)lVar14;
    lStack_10540 = (long)(iVar48 + -1);
    uVar47 = (ulong)(iVar4 + -1);
    lVar59 = 1 - lStack_10540;
    IStack_10640 = 0;
    uStack_105d8 = (ulong)uStack_105d8._4_4_ << 0x20;
    lVar23 = (long)(iVar6 + -1);
    uVar17 = uStack_10550;
    uStack_105d0 = uVar47;
    while (lVar23 <= (long)uStack_10548) {
      lVar41 = lVar23 + uStack_10618;
      uVar18 = lVar23 + -1 + uStack_10618;
      if ((long)uStack_10548 < lVar41) {
        uVar18 = uStack_10548;
      }
      jdim = (uVar18 - lVar23) + 1;
      uVar35 = (int)uStack_105d8;
      if (bVar65) {
        uVar35 = 1;
      }
      uStack_105d8 = CONCAT44(uStack_105d8._4_4_,uVar35);
      dStack_105a8 = (double)(lVar23 + bjlo);
      pDStack_10588 = (DoubleComplex *)(bjlo + uVar18);
      dStack_105b0 = (double)(lVar23 + cjlo);
      pDStack_10590 = (DoubleComplex *)(uVar18 + cjlo);
      pDVar45 = (DoubleComplex *)0x0;
      while (lVar23 = lVar41, (long)pDVar45 <= lVar14) {
        pDStack_10598 = (DoubleComplex *)((long)&pDVar45->real + uVar17);
        lVar23 = (long)pDVar45 + (uVar17 - 1);
        if (lVar14 < (long)pDStack_10598) {
          lVar23 = lVar14;
        }
        kdim = lVar23 + (1 - (long)pDVar45);
        dVar69 = (double)((long)&pDVar45->real + ajlo);
        dVar50 = (double)((long)&pDVar45->real + bilo);
        bVar68 = false;
        lVar19 = lStack_10540;
        lVar37 = lVar59;
        while (lVar19 <= (long)uVar47) {
          uVar17 = (uStack_10650 - 1) + lVar19;
          if ((long)uVar47 < (long)(lVar19 + uStack_10650)) {
            uVar17 = uVar47;
          }
          cdim = uVar17 + lVar37;
          dStack_105e0 = (double)(IStack_10580 + lVar19);
          pDStack_105c0 = (DoubleComplex *)(IStack_10580 + uVar17);
          if ((*pbStack_10570 | 0x20) == 0x6e) {
            pIVar40 = &idim;
            lVar58 = cdim;
            jdim_1 = (Integer)dStack_105e0;
            dStack_105e0 = dVar69;
            kdim_1 = (Integer)pDStack_105c0;
            pDStack_105c0 = (DoubleComplex *)(lVar23 + ajlo);
          }
          else {
            pIVar40 = &kdim;
            lVar58 = kdim;
            jdim_1 = (Integer)dVar69;
            kdim_1 = (Integer)(lVar23 + ajlo);
          }
          idim = cdim;
          pnga_get(g_a,&jdim_1,&kdim_1,pDStack_10638,pIVar40);
          if (!bVar68) {
            pIVar40 = &kdim;
            jdim_1 = (Integer)dVar50;
            dStack_105e0 = dStack_105a8;
            kdim_1 = (Integer)(lVar23 + bilo);
            pDStack_105c0 = pDStack_10588;
            if ((*pbStack_10578 | 0x20) != 0x6e) {
              pIVar40 = &jdim;
              jdim_1 = (Integer)dStack_105a8;
              dStack_105e0 = dVar50;
              kdim_1 = (Integer)pDStack_10588;
              pDStack_105c0 = (DoubleComplex *)(lVar23 + bilo);
            }
            IStack_10640 = *pIVar40;
            pnga_get(g_b,&jdim_1,&kdim_1,pDStack_10620,pIVar40);
          }
          GAI_DGEMM(lVar61,(char *)pbStack_10570,(char *)pbStack_10578,idim,jdim,kdim,alpha,
                    pDStack_10638,lVar58,pDStack_10620,IStack_10640,(DoubleComplex *)cdim_prev,cdim)
          ;
          if (!bVar66) {
            jdim_1 = lVar19 + cilo;
            kdim_1 = uVar17 + cilo;
            if ((lVar61 == 0x3ee) || (lVar61 == 0x3eb)) {
              if ((short)uStack_105d8 == 1) goto LAB_00129542;
              pDVar45 = (DoubleComplex *)&ONE_CF;
            }
            else {
              if ((short)uStack_105d8 == 1) {
LAB_00129542:
                pDStack_105c0 = pDStack_10590;
                dStack_105e0 = dStack_105b0;
                pnga_put(g_c,&jdim_1,&kdim_1,(void *)cdim_prev,&cdim);
                goto LAB_00129580;
              }
              pDVar45 = &ONE;
            }
            pDStack_105c0 = pDStack_10590;
            dStack_105e0 = dStack_105b0;
            pnga_acc(g_c,&jdim_1,&kdim_1,(void *)cdim_prev,&cdim,pDVar45);
          }
LAB_00129580:
          lVar37 = lVar37 - uStack_10650;
          bVar68 = true;
          lVar19 = lVar19 + uStack_10650;
          uVar47 = uStack_105d0;
        }
        uStack_105d8 = uStack_105d8 & 0xffffffff00000000;
        uVar17 = uStack_10550;
        pDVar45 = pDStack_10598;
      }
    }
  }
LAB_0012aa3a:
  if (bVar67) {
    ARMCI_Free_local(a_ar[0]);
  }
  else {
    pnga_free(a_ar[0]);
  }
  if (iStack_1045c != 0) {
    pnga_pgroup_sync(grp_id);
  }
  return;
}

Assistant:

void pnga_matmul(transa, transb, alpha, beta,
	       g_a, ailo, aihi, ajlo, ajhi,
	       g_b, bilo, bihi, bjlo, bjhi,
	       g_c, cilo, cihi, cjlo, cjhi)
     
     Integer g_a, ailo, aihi, ajlo, ajhi;    /* patch of g_a */
     Integer g_b, bilo, bihi, bjlo, bjhi;    /* patch of g_b */
     Integer g_c, cilo, cihi, cjlo, cjhi;    /* patch of g_c */
     void    *alpha, *beta;
     char    *transa, *transb;
{
    DoubleComplex *a=NULL, *b, *c, *a_ar[2], *b_ar[2], *c_ar[2];
    Integer adim1=0, adim2=0, bdim1=0, bdim2=0, cdim1=0, cdim2=0, dims[2];
    Integer atype, btype, ctype, rank, me= pnga_nodeid();
    Integer n, m, k, Ichunk, Kchunk, Jchunk;
    Integer loA[2]={0,0}, hiA[2]={0,0};
    Integer loB[2]={0,0}, hiB[2]={0,0};
    Integer loC[2]={0,0}, hiC[2]={0,0};
    int local_sync_begin,local_sync_end;
    short int need_scaling=SET,use_NB_matmul=SET;
    short int irregular=UNSET, use_armci_memory=UNSET;
    Integer a_grp=pnga_get_pgroup(g_a), b_grp=pnga_get_pgroup(g_b);
    Integer c_grp=pnga_get_pgroup(g_c);
    Integer numblocks;
    Integer clo[2], chi[2];

    /* OPTIMIZATIONS FLAGS. To unset an optimization, replace SET by UNSET) */
    CYCLIC_DISTR_OPT_FLAG  = UNSET;
    CONTIG_CHUNKS_OPT_FLAG = SET;
    DIRECT_ACCESS_OPT_FLAG = SET;

    local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    if(local_sync_begin)pnga_pgroup_sync(a_grp);


    if (a_grp != b_grp || a_grp != c_grp)
       pnga_error("Arrays must be defined on same group",0L);
# if 0 /* disabled. should not fail if there are non-overlapping patches*/
    /* check if C is different from A and B */
    if (g_c == g_a || g_c == g_b)
       pnga_error("Global Array C should be different from A and B", 0);
#endif
    
    /**************************************************
     * Do All Sanity Checks 
     **************************************************/

    /* Check to make sure all global arrays are of the same type */
    if (!(pnga_is_mirrored(g_a) == pnga_is_mirrored(g_b) &&
	  pnga_is_mirrored(g_a) == pnga_is_mirrored(g_c))) {
       pnga_error("Processors do not match for all arrays",pnga_nnodes());
    }

    /* check if ranks are O.K. */
    pnga_inquire(g_a, &atype, &rank, dims); 
    VECTORCHECK(rank, dims, adim1, adim2, ailo, aihi, ajlo, ajhi);
    pnga_inquire(g_b, &btype, &rank, dims); 
    VECTORCHECK(rank, dims, bdim1, bdim2, bilo, bihi, bjlo, bjhi);
    pnga_inquire(g_c, &ctype, &rank, dims); 
    VECTORCHECK(rank, dims, cdim1, cdim2, cilo, cihi, cjlo, cjhi);

    /* check for data-types mismatch */
    if(atype != btype || atype != ctype ) pnga_error(" types mismatch ", 0L);
    if(atype != C_DCPL && atype != C_DBL && atype != C_FLOAT && atype!=C_SCPL)
       pnga_error(" type error",atype);
   
    /* check if patch indices and dims match */
    if (*transa == 'n' || *transa == 'N'){
       if (ailo <= 0 || aihi > adim1 || ajlo <= 0 || ajhi > adim2)
	  pnga_error("  g_a indices out of range ", g_a);
    }else
       if (ailo <= 0 || aihi > adim2 || ajlo <= 0 || ajhi > adim1)
	  pnga_error("  g_a indices out of range ", g_a);
   
    if (*transb == 'n' || *transb == 'N'){
       if (bilo <= 0 || bihi > bdim1 || bjlo <= 0 || bjhi > bdim2)
	  pnga_error("  g_b indices out of range ", g_b);
    }else
       if (bilo <= 0 || bihi > bdim2 || bjlo <= 0 || bjhi > bdim1)
	  pnga_error("  g_b indices out of range ", g_b);
   
    if (cilo <= 0 || cihi > cdim1 || cjlo <= 0 || cjhi > cdim2)
       pnga_error("  g_c indices out of range ", g_c);

    /* verify if patch dimensions are consistent */
    m = aihi - ailo +1;
    n = bjhi - bjlo +1;
    k = ajhi - ajlo +1;
    if( (cihi - cilo +1) != m) pnga_error(" a & c dims error",m);
    if( (cjhi - cjlo +1) != n) pnga_error(" b & c dims error",n);
    if( (bihi - bilo +1) != k) pnga_error(" a & b dims error",k);

#if DEBUG_
    if(me==0) check_result(0, transa, transb, alpha, beta, atype,
			   g_a, ailo, aihi, ajlo, ajhi,
			   g_b, bilo, bihi, bjlo, bjhi,
			   g_c, cilo, cihi, cjlo, cjhi);
    pnga_sync();
#endif

    /* switch to various matmul algorithms here. more to come */
    if( GA[GA_OFFSET + g_c].irreg == 1 ||
	GA[GA_OFFSET + g_b].irreg == 1 ||
	GA[GA_OFFSET + g_a].irreg == 1 ||
	_gai_matmul_patch_flag == SET) irregular = SET;

    /* even ga_dgemm is called, m,n & k might not match GA dimensions */
    pnga_inquire(g_c, &ctype, &rank, dims);
    if(dims[0] != m || dims[1] != n) irregular = SET; /* C matrix dims */

    if(!irregular) {
       if((adim1=GA_Cluster_nnodes()) > 1) use_NB_matmul = SET;
       else {
	  use_NB_matmul = UNSET;
	  CONTIG_CHUNKS_OPT_FLAG = UNSET;
	  DIRECT_ACCESS_OPT_FLAG = UNSET;
       }
    }

    /* if block cyclic, then use regular algorithm. This is turned on for now
     * to test block cyclic */ 
    numblocks = pnga_total_blocks(g_c);
    if(numblocks>=0) {
#if 0
       irregular     = UNSET;
       use_NB_matmul = SET; 
#else
       loA[0] = ailo;
       loA[1] = ajlo;
       hiA[0] = aihi;
       hiA[1] = ajhi;
       loB[0] = bilo;
       loB[1] = bjlo;
       hiB[0] = bihi;
       hiB[1] = bjhi;
       loC[0] = cilo;
       loC[1] = cjlo;
       hiC[0] = cihi;
       hiC[1] = cjhi;
       pnga_matmul_basic(transa, transb, alpha, beta, g_a, loA, hiA,
         g_b, loB, hiB, g_c, loC, hiC);
       return;
#endif
    }
    
    /****************************************************************
     * Get the memory (i.e.static or dynamic) for temporary buffers 
     ****************************************************************/

    /* to skip accumulate and exploit data locality:
       get chunks according to "C" matrix distribution*/
    pnga_distribution(g_a, me, loA, hiA);
    pnga_distribution(g_b, me, loB, hiB);
    pnga_distribution(g_c, me, loC, hiC);

       {
	  Integer elems, factor=sizeof(DoubleComplex)/GAsizeofM(atype);
	  short int nbuf=1;
	  DoubleComplex *tmp = NULL;

	  Ichunk = GA_MIN( (hiC[0]-loC[0]+1), (hiA[0]-loA[0]+1) );
	  Jchunk = GA_MIN( (hiC[1]-loC[1]+1), (hiB[1]-loB[1]+1) );
	  Kchunk = GA_MIN( (hiA[1]-loA[1]+1), (hiB[0]-loB[0]+1) );

#if KCHUNK_OPTIMIZATION /*works great for m=1000,n=1000,k=4000 kinda cases*/
	  pnga_distribution(g_a, me, loC, hiC);
	  Kchunk = hiC[1]-loC[1]+1;
	  pnga_distribution(g_b, me, loC, hiC);
	  Kchunk = GA_MIN(Kchunk, (hiC[0]-loC[0]+1));
#endif

	  /* Just to avoid divide by zero error */
          if(Ichunk<=0) Ichunk = 1;
          if(Jchunk<=0) Jchunk = 1;
          if(Kchunk<=0) Kchunk = 1;

	  {
	     Integer irreg=0;
	     if(Ichunk/Kchunk > GA_ASPECT_RATIO || Kchunk/Ichunk > GA_ASPECT_RATIO || 
		Jchunk/Kchunk > GA_ASPECT_RATIO || Kchunk/Jchunk > GA_ASPECT_RATIO) {
                irreg = SET;
             }
	     pnga_pgroup_gop(a_grp, pnga_type_f2c(MT_F_INT), &irreg, (Integer)1, "max");   
	     if(irreg==SET) irregular = SET;
	  }
	  
	  /* If non-blocking, we need 2 temporary buffers for A and B matrix */
	  if(use_NB_matmul) nbuf = 2; 
	  
	  if(!irregular) {
	     tmp = a_ar[0] =a=gai_get_armci_memory(Ichunk,Jchunk,Kchunk,
						   nbuf, atype);
	     if(tmp != NULL) use_armci_memory = SET;
	  }
	  
	  /* get ChunkSize (i.e.BlockSize), that fits in temporary buffer */
	  gai_get_chunk_size(irregular, &Ichunk, &Jchunk, &Kchunk, &elems, 
			     atype, m, n, k, nbuf, use_armci_memory, a_grp);
	  
	  if(tmp == NULL) { /* try once again from armci for new chunk sizes */
	     tmp = a_ar[0] =a=gai_get_armci_memory(Ichunk,Jchunk,Kchunk,
						   nbuf, atype);
	     if(tmp != NULL) use_armci_memory = SET;
	  }

	  if(tmp == NULL) { /*if armci malloc fails again, then get from MA */
	     tmp = a_ar[0] = a =(DoubleComplex*) pnga_malloc(elems,atype,
                                                      "GA mulmat bufs");
	  }

	  if(use_NB_matmul) tmp = a_ar[1] = a_ar[0] + (Ichunk*Kchunk)/factor+1;
	  
	  tmp = b_ar[0] = b = tmp + (Ichunk*Kchunk)/factor + 1;
	  if(use_NB_matmul) tmp = b_ar[1] = b_ar[0] + (Kchunk*Jchunk)/factor+1;
	  
	  c_ar[0] = c = tmp + (Kchunk*Jchunk)/factor + 1;
       }
       
       /** check if there is a need for scaling the data. 
	   Note: if beta=0, then need_scaling=0  */
       if(atype==C_DCPL){
	  if((((DoubleComplex*)beta)->real == 0) && 
	     (((DoubleComplex*)beta)->imag ==0)) need_scaling =0;} 
       else if(atype==C_SCPL){
	  if((((SingleComplex*)beta)->real == 0) && 
	     (((SingleComplex*)beta)->imag ==0)) need_scaling =0;} 
       else if(atype==C_DBL){
	  if(*(DoublePrecision *)beta == 0) need_scaling =0;}
       else if( *(float*)beta ==0) need_scaling =0;

       clo[0] = cilo; clo[1] = cjlo;
       chi[0] = cihi; chi[1] = cjhi;
       if(need_scaling) pnga_scale_patch(g_c, clo, chi, beta);

       /********************************************************************
	* Parallel Matrix Multiplication Starts Here.
	* 3 Steps:
	*    1. Get a chunk of A and B matrix, and store it in local buffer.
	*    2. Do sequential dgemm.
	*    3. Put/accumulate the result into C matrix.
	*********************************************************************/

       /* if only one node, then enable the optimized shmem code */
       if(use_NB_matmul==UNSET) { 
	  gai_matmul_shmem(transa, transb, alpha, beta, atype,
			   g_a, ailo, aihi, ajlo, ajhi,
			   g_b, bilo, bihi, bjlo, bjhi,
			   g_c, cilo, cihi, cjlo, cjhi,
			   Ichunk, Kchunk, Jchunk, a,b,c, need_scaling);
       }
       else {
	  if(irregular)
	     gai_matmul_irreg(transa, transb, alpha, beta, atype,
			      g_a, ailo, aihi, ajlo, ajhi,
			      g_b, bilo, bihi, bjlo, bjhi,
			      g_c, cilo, cihi, cjlo, cjhi,
			      Ichunk, Kchunk, Jchunk, a_ar, b_ar, c_ar,
			      need_scaling, irregular);
	  else {
	     gai_matmul_regular(transa, transb, alpha, beta, atype,
				g_a, ailo, aihi, ajlo, ajhi,
				g_b, bilo, bihi, bjlo, bjhi,
				g_c, cilo, cihi, cjlo, cjhi,
				Ichunk, Kchunk, Jchunk, a_ar, b_ar, c_ar, 
				need_scaling, irregular);
     }
       }
	     
       a = a_ar[0];
       if(use_armci_memory == SET) ARMCI_Free_local(a);
       else {
         pnga_free(a);
       }
       
#if DEBUG_
       Integer grp_me;
       grp_me = pnga_pgroup_nodeid(a_grp);
       pnga_pgroup_sync(a_grp);
       if(me==0) check_result(1, transa, transb, alpha, beta, atype,
			      g_a, ailo, aihi, ajlo, ajhi,
			      g_b, bilo, bihi, bjlo, bjhi,
			      g_c, cilo, cihi, cjlo, cjhi);
       pnga_pgroup_sync(a_grp);
#endif
       
       if(local_sync_end)pnga_pgroup_sync(a_grp);
}